

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_kill(void)

{
  int iVar1;
  __uid_t _Var2;
  uint uVar3;
  int extraout_EAX;
  uv_exit_cb p_Var4;
  undefined8 uVar5;
  uv_process_options_t *__nmemb;
  passwd *ppVar6;
  uv_process_options_t *puVar7;
  int *piVar8;
  uv_process_options_t *puVar9;
  uv_buf_t *buf;
  undefined1 *nread;
  uv_stream_t *tcp;
  char *unaff_R12;
  uv_process_options_t *unaff_R14;
  uv_process_options_t *unaff_R15;
  undefined1 auVar10 [16];
  int64_t eval_a;
  int64_t eval_b;
  sigset_t set;
  undefined1 auStack_9f8 [48];
  uv_handle_t *apuStack_9c8 [11];
  uv_loop_t *puStack_970;
  undefined8 auStack_808 [29];
  uv_stdio_container_t uStack_720;
  undefined4 uStack_710;
  undefined4 uStack_700;
  uv_process_options_t *puStack_6e8;
  long lStack_6b0;
  uint uStack_6a8;
  int iStack_6a4;
  undefined1 auStack_6a0 [16];
  undefined8 uStack_690;
  undefined2 uStack_688;
  uv_stdio_container_t uStack_680;
  long alStack_668 [25];
  long alStack_5a0 [25];
  long alStack_4d8 [29];
  undefined1 auStack_3f0 [88];
  uint uStack_398;
  uv_process_options_t *puStack_230;
  uv_process_options_t *puStack_228;
  uv_process_options_t *puStack_220;
  long lStack_218;
  long lStack_210;
  uv_process_options_t *puStack_208;
  char cStack_1f1;
  long lStack_1f0;
  long lStack_1e8;
  uv_process_options_t *puStack_1e0;
  uv_process_options_t *puStack_1d8;
  uv_process_options_t *apuStack_1d0 [2];
  uv_process_options_t *puStack_1c0;
  cpu_set_t cStack_1b8;
  uv_process_options_t *puStack_130;
  char *pcStack_128;
  uv_process_options_t *puStack_120;
  uv_process_options_t *puStack_118;
  long lStack_110;
  long lStack_108;
  uv_process_options_t *puStack_100;
  long lStack_f8;
  long lStack_f0;
  uv_process_options_t *puStack_e8;
  long lStack_e0;
  long lStack_d8;
  char acStack_c2 [10];
  uv_process_options_t *puStack_b8;
  sigset_t local_88;
  
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&local_88);
  sigaddset(&local_88,0xf);
  iVar1 = pthread_sigmask(0,&local_88,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    local_88.__val[0] = 0xffffffffffffffff;
    p_Var4 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x1);
    if ((uv_exit_cb)local_88.__val[0] == p_Var4) goto LAB_001c2097;
    uVar5 = uv_default_loop();
    iVar1 = uv_spawn(uVar5,&process,&options);
    local_88.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)local_88.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20a4;
    sigemptyset(&local_88);
    sigaddset(&local_88,0xf);
    iVar1 = pthread_sigmask(1,&local_88,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_001c20b1;
    local_88.__val[0] = 0xffffffffffffffff;
    p_Var4 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x0);
    if ((uv_exit_cb)local_88.__val[0] == p_Var4) goto LAB_001c20be;
    iVar1 = uv_kill(process.pid,0);
    local_88.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)local_88.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20cb;
    iVar1 = uv_kill(process.pid,0xf);
    local_88.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)local_88.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20d8;
    uVar5 = uv_default_loop();
    iVar1 = uv_run(uVar5,0);
    local_88.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)local_88.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20e5;
    local_88.__val[0] = 1;
    if (exit_cb_called != 1) goto LAB_001c20f2;
    local_88.__val[0] = 1;
    if (close_cb_called != 1) goto LAB_001c20ff;
    __nmemb = (uv_process_options_t *)uv_default_loop();
    uv_walk(__nmemb,close_walk_cb,0);
    uv_run(__nmemb,0);
    local_88.__val[0] = 0;
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    if ((uv_exit_cb)local_88.__val[0] == (uv_exit_cb)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_001c2097:
    run_test_kill_cold_11();
LAB_001c20a4:
    run_test_kill_cold_2();
LAB_001c20b1:
    run_test_kill_cold_3();
LAB_001c20be:
    run_test_kill_cold_10();
LAB_001c20cb:
    run_test_kill_cold_4();
LAB_001c20d8:
    run_test_kill_cold_5();
LAB_001c20e5:
    run_test_kill_cold_6();
LAB_001c20f2:
    run_test_kill_cold_7();
LAB_001c20ff:
    __nmemb = (uv_process_options_t *)&local_88;
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  puStack_e8 = (uv_process_options_t *)0x1c2129;
  puStack_b8 = __nmemb;
  _Var2 = getuid();
  if (_Var2 != 0) {
    puStack_e8 = (uv_process_options_t *)0x1c22e8;
    run_test_spawn_setuid_setgid_cold_1();
    return 7;
  }
  puStack_e8 = (uv_process_options_t *)0x1c2144;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  puStack_e8 = (uv_process_options_t *)0x1c2150;
  ppVar6 = getpwnam("nobody");
  if (ppVar6 == (passwd *)0x0) {
    puStack_e8 = (uv_process_options_t *)0x1c22fb;
    run_test_spawn_setuid_setgid_cold_8();
LAB_001c22fb:
    puStack_e8 = (uv_process_options_t *)0x1c2308;
    run_test_spawn_setuid_setgid_cold_2();
LAB_001c2308:
    puStack_e8 = (uv_process_options_t *)0x1c2315;
    run_test_spawn_setuid_setgid_cold_3();
LAB_001c2315:
    puStack_e8 = (uv_process_options_t *)0x1c2322;
    run_test_spawn_setuid_setgid_cold_4();
LAB_001c2322:
    puStack_e8 = (uv_process_options_t *)0x1c232f;
    run_test_spawn_setuid_setgid_cold_5();
  }
  else {
    options.uid = ppVar6->pw_uid;
    __nmemb = &options;
    options.gid = ppVar6->pw_gid;
    unaff_R15 = (uv_process_options_t *)0x1e6b28;
    unaff_R12 = acStack_c2;
    puStack_e8 = (uv_process_options_t *)0x1c2198;
    snprintf(unaff_R12,10,"%d",(ulong)ppVar6->pw_uid);
    unaff_R14 = (uv_process_options_t *)&stack0xffffffffffffff34;
    puStack_e8 = (uv_process_options_t *)0x1c21b3;
    snprintf((char *)unaff_R14,10,"%d",(ulong)ppVar6->pw_gid);
    options.args[2] = unaff_R12;
    options.args[3] = (char *)unaff_R14;
    options.flags = 3;
    puStack_e8 = (uv_process_options_t *)0x1c21d8;
    uVar5 = uv_default_loop();
    puStack_e8 = (uv_process_options_t *)0x1c21ea;
    iVar1 = uv_spawn(uVar5,&process,&options);
    if (iVar1 == -0xd) {
      puStack_e8 = (uv_process_options_t *)0x1c22ef;
      run_test_spawn_setuid_setgid_cold_7();
      return 7;
    }
    lStack_d8 = (long)iVar1;
    lStack_e0 = 0;
    if (lStack_d8 != 0) goto LAB_001c22fb;
    puStack_e8 = (uv_process_options_t *)0x1c2216;
    uVar5 = uv_default_loop();
    puStack_e8 = (uv_process_options_t *)0x1c2220;
    iVar1 = uv_run(uVar5,0);
    lStack_d8 = (long)iVar1;
    lStack_e0 = 0;
    if (lStack_d8 != 0) goto LAB_001c2308;
    lStack_d8 = 1;
    lStack_e0 = (long)exit_cb_called;
    if (lStack_e0 != 1) goto LAB_001c2315;
    lStack_d8 = 1;
    lStack_e0 = (long)close_cb_called;
    if (lStack_e0 != 1) goto LAB_001c2322;
    puStack_e8 = (uv_process_options_t *)0x1c2289;
    unaff_R14 = (uv_process_options_t *)uv_default_loop();
    __nmemb = (uv_process_options_t *)0x0;
    puStack_e8 = (uv_process_options_t *)0x1c229f;
    uv_walk(unaff_R14,close_walk_cb,0);
    puStack_e8 = (uv_process_options_t *)0x1c22a9;
    uv_run(unaff_R14,0);
    lStack_d8 = 0;
    puStack_e8 = (uv_process_options_t *)0x1c22b7;
    uVar5 = uv_default_loop();
    puStack_e8 = (uv_process_options_t *)0x1c22bf;
    iVar1 = uv_loop_close(uVar5);
    lStack_e0 = (long)iVar1;
    if (lStack_d8 == lStack_e0) {
      puStack_e8 = (uv_process_options_t *)0x1c22d5;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_e8 = (uv_process_options_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_6();
  puStack_100 = (uv_process_options_t *)0x1c2346;
  puStack_e8 = __nmemb;
  _Var2 = getuid();
  if (_Var2 == 0) {
    puStack_100 = (uv_process_options_t *)0x1c2356;
    puVar7 = (uv_process_options_t *)getpwnam("nobody");
    if (puVar7 == (uv_process_options_t *)0x0) goto LAB_001c24e5;
    puStack_100 = (uv_process_options_t *)0x1c236a;
    iVar1 = setgid(*(__gid_t *)((long)&puVar7->args + 4));
    lStack_f0 = (long)iVar1;
    lStack_f8 = 0;
    __nmemb = puVar7;
    if (lStack_f0 != 0) goto LAB_001c24ea;
    puStack_100 = (uv_process_options_t *)0x1c2390;
    iVar1 = setuid(*(__uid_t *)&puVar7->args);
    lStack_f0 = (long)iVar1;
    lStack_f8 = 0;
    if (lStack_f0 == 0) goto LAB_001c23ae;
  }
  else {
LAB_001c23ae:
    puStack_100 = (uv_process_options_t *)0x1c23c1;
    init_process_options("spawn_helper1",fail_cb);
    __nmemb = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    puStack_100 = (uv_process_options_t *)0x1c23de;
    uVar5 = uv_default_loop();
    puStack_100 = (uv_process_options_t *)0x1c23f0;
    iVar1 = uv_spawn(uVar5,&process,&options);
    lStack_f0 = (long)iVar1;
    lStack_f8 = -1;
    if (lStack_f0 == -1) {
      puStack_100 = (uv_process_options_t *)0x1c2413;
      uVar5 = uv_default_loop();
      puStack_100 = (uv_process_options_t *)0x1c241d;
      iVar1 = uv_run(uVar5,0);
      lStack_f0 = (long)iVar1;
      lStack_f8 = 0;
      if (lStack_f0 != 0) goto LAB_001c24be;
      lStack_f0 = (long)close_cb_called;
      lStack_f8 = 0;
      if (lStack_f0 != 0) goto LAB_001c24cb;
      puStack_100 = (uv_process_options_t *)0x1c245f;
      __nmemb = (uv_process_options_t *)uv_default_loop();
      puStack_100 = (uv_process_options_t *)0x1c2473;
      uv_walk(__nmemb,close_walk_cb,0);
      puStack_100 = (uv_process_options_t *)0x1c247d;
      uv_run(__nmemb,0);
      lStack_f0 = 0;
      puStack_100 = (uv_process_options_t *)0x1c248b;
      uVar5 = uv_default_loop();
      puStack_100 = (uv_process_options_t *)0x1c2493;
      iVar1 = uv_loop_close(uVar5);
      lStack_f8 = (long)iVar1;
      if (lStack_f0 == lStack_f8) {
        puStack_100 = (uv_process_options_t *)0x1c24a9;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_100 = (uv_process_options_t *)0x1c24be;
      run_test_spawn_setuid_fails_cold_3();
LAB_001c24be:
      puStack_100 = (uv_process_options_t *)0x1c24cb;
      run_test_spawn_setuid_fails_cold_4();
LAB_001c24cb:
      puStack_100 = (uv_process_options_t *)0x1c24d8;
      run_test_spawn_setuid_fails_cold_5();
    }
    puStack_100 = (uv_process_options_t *)0x1c24e5;
    run_test_spawn_setuid_fails_cold_6();
LAB_001c24e5:
    puStack_100 = (uv_process_options_t *)0x1c24ea;
    run_test_spawn_setuid_fails_cold_7();
LAB_001c24ea:
    puStack_100 = (uv_process_options_t *)0x1c24f7;
    run_test_spawn_setuid_fails_cold_1();
  }
  puStack_100 = (uv_process_options_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  puStack_118 = (uv_process_options_t *)0x1c250e;
  puStack_100 = __nmemb;
  _Var2 = getuid();
  if (_Var2 == 0) {
    puStack_118 = (uv_process_options_t *)0x1c251e;
    puVar7 = (uv_process_options_t *)getpwnam("nobody");
    if (puVar7 == (uv_process_options_t *)0x0) goto LAB_001c26ad;
    puStack_118 = (uv_process_options_t *)0x1c2532;
    iVar1 = setgid(*(__gid_t *)((long)&puVar7->args + 4));
    lStack_108 = (long)iVar1;
    lStack_110 = 0;
    __nmemb = puVar7;
    if (lStack_108 != 0) goto LAB_001c26b2;
    puStack_118 = (uv_process_options_t *)0x1c2558;
    iVar1 = setuid(*(__uid_t *)&puVar7->args);
    lStack_108 = (long)iVar1;
    lStack_110 = 0;
    if (lStack_108 == 0) goto LAB_001c2576;
  }
  else {
LAB_001c2576:
    puStack_118 = (uv_process_options_t *)0x1c2589;
    init_process_options("spawn_helper1",fail_cb);
    __nmemb = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    puStack_118 = (uv_process_options_t *)0x1c25a6;
    uVar5 = uv_default_loop();
    puStack_118 = (uv_process_options_t *)0x1c25b8;
    iVar1 = uv_spawn(uVar5,&process,&options);
    lStack_108 = (long)iVar1;
    lStack_110 = -1;
    if (lStack_108 == -1) {
      puStack_118 = (uv_process_options_t *)0x1c25db;
      uVar5 = uv_default_loop();
      puStack_118 = (uv_process_options_t *)0x1c25e5;
      iVar1 = uv_run(uVar5,0);
      lStack_108 = (long)iVar1;
      lStack_110 = 0;
      if (lStack_108 != 0) goto LAB_001c2686;
      lStack_108 = (long)close_cb_called;
      lStack_110 = 0;
      if (lStack_108 != 0) goto LAB_001c2693;
      puStack_118 = (uv_process_options_t *)0x1c2627;
      __nmemb = (uv_process_options_t *)uv_default_loop();
      puStack_118 = (uv_process_options_t *)0x1c263b;
      uv_walk(__nmemb,close_walk_cb,0);
      puStack_118 = (uv_process_options_t *)0x1c2645;
      uv_run(__nmemb,0);
      lStack_108 = 0;
      puStack_118 = (uv_process_options_t *)0x1c2653;
      uVar5 = uv_default_loop();
      puStack_118 = (uv_process_options_t *)0x1c265b;
      iVar1 = uv_loop_close(uVar5);
      lStack_110 = (long)iVar1;
      if (lStack_108 == lStack_110) {
        puStack_118 = (uv_process_options_t *)0x1c2671;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_118 = (uv_process_options_t *)0x1c2686;
      run_test_spawn_setgid_fails_cold_3();
LAB_001c2686:
      puStack_118 = (uv_process_options_t *)0x1c2693;
      run_test_spawn_setgid_fails_cold_4();
LAB_001c2693:
      puStack_118 = (uv_process_options_t *)0x1c26a0;
      run_test_spawn_setgid_fails_cold_5();
    }
    puStack_118 = (uv_process_options_t *)0x1c26ad;
    run_test_spawn_setgid_fails_cold_6();
LAB_001c26ad:
    puStack_118 = (uv_process_options_t *)0x1c26b2;
    run_test_spawn_setgid_fails_cold_7();
LAB_001c26b2:
    puStack_118 = (uv_process_options_t *)0x1c26bf;
    run_test_spawn_setgid_fails_cold_1();
  }
  puStack_118 = (uv_process_options_t *)run_test_spawn_affinity;
  run_test_spawn_setgid_fails_cold_2();
  puStack_1e0 = (uv_process_options_t *)0x1c26df;
  puStack_130 = __nmemb;
  pcStack_128 = unaff_R12;
  puStack_120 = unaff_R14;
  puStack_118 = unaff_R15;
  uVar3 = uv_cpumask_size();
  if ((int)uVar3 < 1) {
    puStack_1e0 = (uv_process_options_t *)0x1c28c8;
    run_test_spawn_affinity_cold_1();
LAB_001c28c8:
    puStack_1e0 = (uv_process_options_t *)0x1c28d5;
    run_test_spawn_affinity_cold_2();
LAB_001c28d5:
    puStack_1e0 = (uv_process_options_t *)0x1c28e2;
    run_test_spawn_affinity_cold_3();
    puVar7 = __nmemb;
LAB_001c28e2:
    puVar9 = unaff_R14;
    puStack_1e0 = (uv_process_options_t *)0x1c28e7;
    run_test_spawn_affinity_cold_9();
LAB_001c28e7:
    puStack_1e0 = (uv_process_options_t *)0x1c28ec;
    run_test_spawn_affinity_cold_4();
LAB_001c28ec:
    puStack_1e0 = (uv_process_options_t *)0x1c28f1;
    run_test_spawn_affinity_cold_5();
LAB_001c28f1:
    puStack_1e0 = (uv_process_options_t *)0x1c28f6;
    run_test_spawn_affinity_cold_6();
LAB_001c28f6:
    puStack_1e0 = (uv_process_options_t *)0x1c28fb;
    run_test_spawn_affinity_cold_7();
  }
  else {
    __nmemb = (uv_process_options_t *)(ulong)uVar3;
    cStack_1b8.__bits[0xe] = 0;
    cStack_1b8.__bits[0xf] = 0;
    cStack_1b8.__bits[0xc] = 0;
    cStack_1b8.__bits[0xd] = 0;
    cStack_1b8.__bits[10] = 0;
    cStack_1b8.__bits[0xb] = 0;
    cStack_1b8.__bits[8] = 0;
    cStack_1b8.__bits[9] = 0;
    cStack_1b8.__bits[6] = 0;
    cStack_1b8.__bits[7] = 0;
    cStack_1b8.__bits[4] = 0;
    cStack_1b8.__bits[5] = 0;
    cStack_1b8.__bits[2] = 0;
    cStack_1b8.__bits[3] = 0;
    cStack_1b8.__bits[0] = 0;
    cStack_1b8.__bits[1] = 0;
    unaff_R14 = (uv_process_options_t *)0x0;
    puStack_1e0 = (uv_process_options_t *)0x1c271f;
    iVar1 = sched_getaffinity(0,0x80,&cStack_1b8);
    if (iVar1 != 0) {
      puStack_1e0 = (uv_process_options_t *)0x1c2728;
      piVar8 = __errno_location();
      unaff_R14 = (uv_process_options_t *)(long)*piVar8;
    }
    puStack_1d8 = (uv_process_options_t *)0x0;
    apuStack_1d0[0] = unaff_R14;
    if (unaff_R14 != (uv_process_options_t *)0x0) goto LAB_001c28c8;
    __nmemb = (uv_process_options_t *)(ulong)uVar3;
    puVar7 = (uv_process_options_t *)0x0;
    do {
      if ((puVar7 < (uv_process_options_t *)0x400) &&
         (puVar9 = puVar7,
         (cStack_1b8.__bits[(ulong)puVar7 >> 6] >> ((ulong)puVar7 & 0x3f) & 1) != 0)) break;
      puVar7 = (uv_process_options_t *)((long)&puVar7->exit_cb + 1);
      puVar9 = __nmemb;
    } while (__nmemb != puVar7);
    unaff_R15 = (uv_process_options_t *)((ulong)puVar9 & 0xffffffff);
    puStack_1d8 = __nmemb;
    apuStack_1d0[0] = unaff_R15;
    if (__nmemb <= unaff_R15) goto LAB_001c28d5;
    puStack_1e0 = (uv_process_options_t *)0x1c27a8;
    snprintf((char *)apuStack_1d0,0xb,"%d",unaff_R15);
    puStack_1e0 = (uv_process_options_t *)0x1c27bb;
    init_process_options("spawn_helper_affinity",exit_cb);
    puStack_1e0 = (uv_process_options_t *)0x1c27c8;
    puVar9 = (uv_process_options_t *)calloc((size_t)__nmemb,1);
    puVar7 = __nmemb;
    if (puVar9 == (uv_process_options_t *)0x0) goto LAB_001c28e2;
    *(char *)((long)&unaff_R15->exit_cb + (long)&puVar9->exit_cb) = '\x01';
    puVar7 = &options;
    options.cpumask = (char *)puVar9;
    options.cpumask_size = (size_t)__nmemb;
    options.args[2] = (char *)apuStack_1d0;
    options.args[3] = "dummy";
    puStack_1e0 = (uv_process_options_t *)0x1c2810;
    uVar5 = uv_default_loop();
    puStack_1e0 = (uv_process_options_t *)0x1c2822;
    iVar1 = uv_spawn(uVar5,&process,&options);
    if (iVar1 != 0) goto LAB_001c28e7;
    puStack_1e0 = (uv_process_options_t *)0x1c282f;
    uVar5 = uv_default_loop();
    puStack_1e0 = (uv_process_options_t *)0x1c2839;
    iVar1 = uv_run(uVar5,0);
    if (iVar1 != 0) goto LAB_001c28ec;
    if (exit_cb_called != 1) goto LAB_001c28f1;
    if (close_cb_called != 1) goto LAB_001c28f6;
    puStack_1e0 = (uv_process_options_t *)0x1c2863;
    free(puVar9);
    puStack_1e0 = (uv_process_options_t *)0x1c2868;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    puStack_1e0 = (uv_process_options_t *)0x1c287c;
    uv_walk(puVar7,close_walk_cb,0);
    puStack_1e0 = (uv_process_options_t *)0x1c2886;
    uv_run(puVar7,0);
    puStack_1d8 = (uv_process_options_t *)0x0;
    puStack_1e0 = (uv_process_options_t *)0x1c2893;
    uVar5 = uv_default_loop();
    puStack_1e0 = (uv_process_options_t *)0x1c289b;
    iVar1 = uv_loop_close(uVar5);
    puStack_1c0 = (uv_process_options_t *)(long)iVar1;
    if (puStack_1d8 == puStack_1c0) {
      puStack_1e0 = (uv_process_options_t *)0x1c28b2;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_1e0 = (uv_process_options_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  puStack_208 = (uv_process_options_t *)0x1c2912;
  puStack_1e0 = puVar7;
  iVar1 = uv_cpumask_size();
  if (iVar1 < 1) {
    puStack_208 = (uv_process_options_t *)0x1c29d1;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001c29d1:
    puStack_208 = (uv_process_options_t *)0x1c29d6;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001c29d6:
    puStack_208 = (uv_process_options_t *)0x1c29db;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    puStack_208 = (uv_process_options_t *)0x1c292d;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_1f1;
    cStack_1f1 = '\0';
    options.cpumask_size = 0;
    puVar7 = &options;
    puStack_208 = (uv_process_options_t *)0x1c2953;
    uVar5 = uv_default_loop();
    puStack_208 = (uv_process_options_t *)0x1c2965;
    iVar1 = uv_spawn(uVar5,&process,&options);
    if (iVar1 != -0x16) goto LAB_001c29d1;
    if (exit_cb_called != 0) goto LAB_001c29d6;
    puStack_208 = (uv_process_options_t *)0x1c2978;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    puStack_208 = (uv_process_options_t *)0x1c298c;
    uv_walk(puVar7,close_walk_cb,0);
    puStack_208 = (uv_process_options_t *)0x1c2996;
    uv_run(puVar7,0);
    lStack_1e8 = 0;
    puStack_208 = (uv_process_options_t *)0x1c29a4;
    uVar5 = uv_default_loop();
    puStack_208 = (uv_process_options_t *)0x1c29ac;
    iVar1 = uv_loop_close(uVar5);
    lStack_1f0 = (long)iVar1;
    if (lStack_1e8 == lStack_1f0) {
      puStack_208 = (uv_process_options_t *)0x1c29c4;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_208 = (uv_process_options_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_220 = (uv_process_options_t *)0x1c29fd;
  puStack_208 = puVar7;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_220 = (uv_process_options_t *)0x1c2a02;
  uVar5 = uv_default_loop();
  puStack_220 = (uv_process_options_t *)0x1c2a18;
  iVar1 = uv_spawn(uVar5,&process,&options);
  lStack_210 = (long)iVar1;
  lStack_218 = 0;
  if (lStack_210 == 0) {
    puStack_220 = (uv_process_options_t *)0x1c2a3b;
    uVar5 = uv_default_loop();
    puStack_220 = (uv_process_options_t *)0x1c2a45;
    iVar1 = uv_run(uVar5,0);
    lStack_210 = (long)iVar1;
    lStack_218 = 0;
    if (lStack_210 != 0) goto LAB_001c2b56;
    puStack_220 = (uv_process_options_t *)0x1c2a6f;
    iVar1 = uv_is_closing(&process);
    lStack_210 = (long)iVar1;
    lStack_218 = 0;
    if (lStack_210 != 0) goto LAB_001c2b63;
    puStack_220 = (uv_process_options_t *)0x1c2a9b;
    uv_close(&process,0);
    puStack_220 = (uv_process_options_t *)0x1c2aa0;
    uVar5 = uv_default_loop();
    puStack_220 = (uv_process_options_t *)0x1c2aaa;
    iVar1 = uv_run(uVar5,0);
    lStack_210 = (long)iVar1;
    lStack_218 = 0;
    if (lStack_210 != 0) goto LAB_001c2b70;
    lStack_210 = 1;
    puStack_220 = (uv_process_options_t *)0x1c2add;
    iVar1 = uv_is_closing(&process);
    lStack_218 = (long)iVar1;
    if (lStack_210 != lStack_218) goto LAB_001c2b7d;
    puStack_220 = (uv_process_options_t *)0x1c2af7;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    puStack_220 = (uv_process_options_t *)0x1c2b0b;
    uv_walk(puVar7,close_walk_cb,0);
    puStack_220 = (uv_process_options_t *)0x1c2b15;
    uv_run(puVar7,0);
    lStack_210 = 0;
    puStack_220 = (uv_process_options_t *)0x1c2b23;
    uVar5 = uv_default_loop();
    puStack_220 = (uv_process_options_t *)0x1c2b2b;
    iVar1 = uv_loop_close(uVar5);
    lStack_218 = (long)iVar1;
    if (lStack_210 == lStack_218) {
      puStack_220 = (uv_process_options_t *)0x1c2b41;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_220 = (uv_process_options_t *)0x1c2b56;
    run_test_spawn_auto_unref_cold_1();
LAB_001c2b56:
    puStack_220 = (uv_process_options_t *)0x1c2b63;
    run_test_spawn_auto_unref_cold_2();
LAB_001c2b63:
    puStack_220 = (uv_process_options_t *)0x1c2b70;
    run_test_spawn_auto_unref_cold_3();
LAB_001c2b70:
    puStack_220 = (uv_process_options_t *)0x1c2b7d;
    run_test_spawn_auto_unref_cold_4();
LAB_001c2b7d:
    puStack_220 = (uv_process_options_t *)0x1c2b8a;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_220 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  uStack_690 = 0x6c756e2f7665642f;
  uStack_688 = 0x6c;
  puStack_230 = puVar7;
  puStack_228 = puVar9;
  puStack_220 = unaff_R15;
  iVar1 = uv_fs_open(0,auStack_3f0,&uStack_690,2,0,0);
  alStack_4d8[0] = (long)iVar1;
  alStack_5a0[0] = 0;
  if (alStack_4d8[0] == 0) {
    puVar7 = (uv_process_options_t *)(ulong)uStack_398;
    uStack_6a8 = uStack_398;
    init_process_options("spawn_helper8",exit_cb);
    uVar5 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar5,(uv_stream_t *)alStack_4d8,0);
    alStack_5a0[0] = (long)iVar1;
    alStack_668[0] = 0;
    if (alStack_5a0[0] != 0) goto LAB_001c2eb0;
    options.stdio = &uStack_680;
    uStack_680.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_680.data.stream = (uv_stream_t *)alStack_4d8;
    iStack_6a4 = dup(uStack_398);
    uVar5 = uv_default_loop();
    iVar1 = uv_spawn(uVar5,&process,&options);
    alStack_5a0[0] = (long)iVar1;
    alStack_668[0] = 0;
    if (alStack_5a0[0] != 0) goto LAB_001c2ec2;
    auStack_6a0 = uv_buf_init(&uStack_6a8,4);
    iVar1 = uv_write(alStack_5a0,alStack_4d8,auStack_6a0,1,write_null_cb);
    alStack_668[0] = (long)iVar1;
    if (alStack_668[0] != 0) goto LAB_001c2ed4;
    auVar10 = uv_buf_init(&iStack_6a4,4);
    auStack_6a0 = auVar10;
    iVar1 = uv_write(alStack_668,alStack_4d8,auStack_6a0,1,write_cb);
    lStack_6b0 = 0;
    if (iVar1 != 0) goto LAB_001c2ee3;
    uVar5 = uv_default_loop();
    iVar1 = uv_run(uVar5,0);
    lStack_6b0 = 0;
    if (iVar1 != 0) goto LAB_001c2ef2;
    iVar1 = uv_fs_close(0,auStack_3f0,uStack_6a8,0);
    lStack_6b0 = 0;
    if (iVar1 != 0) goto LAB_001c2f01;
    lStack_6b0 = (long)exit_cb_called;
    if (lStack_6b0 != 1) goto LAB_001c2f10;
    lStack_6b0 = (long)close_cb_called;
    if (lStack_6b0 != 2) goto LAB_001c2f1f;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar7,close_walk_cb,0);
    uv_run(puVar7,0);
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    lStack_6b0 = (long)iVar1;
    if (lStack_6b0 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001c2eb0:
    run_test_spawn_fs_open_cold_2();
LAB_001c2ec2:
    run_test_spawn_fs_open_cold_3();
LAB_001c2ed4:
    run_test_spawn_fs_open_cold_4();
LAB_001c2ee3:
    run_test_spawn_fs_open_cold_5();
LAB_001c2ef2:
    run_test_spawn_fs_open_cold_6();
LAB_001c2f01:
    run_test_spawn_fs_open_cold_7();
LAB_001c2f10:
    run_test_spawn_fs_open_cold_8();
LAB_001c2f1f:
    run_test_spawn_fs_open_cold_9();
  }
  iVar1 = (int)&lStack_6b0;
  run_test_spawn_fs_open_cold_10();
  if (iVar1 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  puStack_6e8 = puVar7;
  auStack_9f8._24_16_ = uv_buf_init("",1);
  iVar1 = uv_pipe(auStack_9f8 + 0x10,0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_720;
    uStack_720.flags = UV_INHERIT_FD;
    uStack_720.data.file = auStack_9f8._16_4_;
    uStack_710 = 0;
    uStack_700 = 0;
    uVar5 = uv_default_loop();
    iVar1 = uv_spawn(uVar5,&process,&options);
    apuStack_9c8[0] = (uv_handle_t *)(long)iVar1;
    auStack_808[0] = 0;
    if (apuStack_9c8[0] != (uv_handle_t *)0x0) goto LAB_001c33eb;
    uv_unref(&process);
    uVar5 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar5,auStack_808,0);
    apuStack_9c8[0] = (uv_handle_t *)(long)iVar1;
    auStack_9f8._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_9c8[0] != (uv_handle_t *)0x0) goto LAB_001c33fd;
    iVar1 = uv_pipe_open(auStack_808,auStack_9f8._16_4_);
    apuStack_9c8[0] = (uv_handle_t *)(long)iVar1;
    auStack_9f8._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_9c8[0] != (uv_handle_t *)0x0) goto LAB_001c340c;
    auStack_9f8._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start(auStack_808,on_alloc,on_read_once);
    apuStack_9c8[0] = (uv_handle_t *)(long)iVar1;
    auStack_9f8._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_9c8[0] != (uv_handle_t *)0x0) goto LAB_001c341b;
    auStack_9f8._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_9c8,auStack_9f8._20_4_,auStack_9f8 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_9f8._8_8_ = SEXT48(iVar1);
    if (auStack_9f8._0_8_ != auStack_9f8._8_8_) goto LAB_001c342a;
    auStack_9f8._0_8_ = (uv_loop_t *)0x1;
    auStack_9f8._8_8_ = puStack_970;
    if (puStack_970 != (uv_loop_t *)0x1) goto LAB_001c3439;
    uv_fs_req_cleanup(apuStack_9c8);
    uVar5 = uv_default_loop();
    iVar1 = uv_run(uVar5,1);
    auStack_9f8._0_8_ = SEXT48(iVar1);
    auStack_9f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_9f8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3448;
    auStack_9f8._0_8_ = (uv_loop_t *)0x1;
    auStack_9f8._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_9f8._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3457;
    uv_close(auStack_808,close_cb);
    auStack_9f8._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_9c8,auStack_9f8._20_4_,auStack_9f8 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_9f8._8_8_ = SEXT48(iVar1);
    if (auStack_9f8._0_8_ != auStack_9f8._8_8_) goto LAB_001c3466;
    auStack_9f8._0_8_ = (uv_loop_t *)0x1;
    auStack_9f8._8_8_ = puStack_970;
    if (puStack_970 != (uv_loop_t *)0x1) goto LAB_001c3475;
    uv_fs_req_cleanup(apuStack_9c8);
    uVar5 = uv_default_loop();
    iVar1 = uv_timer_init(uVar5,&timer);
    auStack_9f8._0_8_ = SEXT48(iVar1);
    auStack_9f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_9f8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3484;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_9f8._0_8_ = SEXT48(iVar1);
    auStack_9f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_9f8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3493;
    uVar5 = uv_default_loop();
    iVar1 = uv_run(uVar5,1);
    if (iVar1 == 1) {
      uVar5 = uv_default_loop();
      iVar1 = uv_run(uVar5,1);
      auStack_9f8._0_8_ = SEXT48(iVar1);
      auStack_9f8._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_9f8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34de;
    }
    auStack_9f8._0_8_ = (uv_loop_t *)0x1;
    auStack_9f8._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_9f8._8_8_ != (uv_loop_t *)0x1) goto LAB_001c34a2;
    iVar1 = uv_process_kill(&process,0xf);
    auStack_9f8._0_8_ = SEXT48(iVar1);
    auStack_9f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_9f8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b1;
    iVar1 = close(auStack_9f8._20_4_);
    auStack_9f8._0_8_ = SEXT48(iVar1);
    auStack_9f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_9f8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34c0;
    auStack_9f8._20_4_ = -1;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    auStack_9f8._0_8_ = (uv_loop_t *)0x0;
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    auStack_9f8._8_8_ = SEXT48(iVar1);
    if (auStack_9f8._0_8_ == auStack_9f8._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33eb:
    run_test_closed_fd_events_cold_2();
LAB_001c33fd:
    run_test_closed_fd_events_cold_3();
LAB_001c340c:
    run_test_closed_fd_events_cold_4();
LAB_001c341b:
    run_test_closed_fd_events_cold_5();
LAB_001c342a:
    run_test_closed_fd_events_cold_6();
LAB_001c3439:
    run_test_closed_fd_events_cold_7();
LAB_001c3448:
    run_test_closed_fd_events_cold_8();
LAB_001c3457:
    run_test_closed_fd_events_cold_9();
LAB_001c3466:
    run_test_closed_fd_events_cold_10();
LAB_001c3475:
    run_test_closed_fd_events_cold_11();
LAB_001c3484:
    run_test_closed_fd_events_cold_12();
LAB_001c3493:
    run_test_closed_fd_events_cold_13();
LAB_001c34a2:
    run_test_closed_fd_events_cold_15();
LAB_001c34b1:
    run_test_closed_fd_events_cold_16();
LAB_001c34c0:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34de:
  tcp = (uv_stream_t *)auStack_9f8;
  nread = auStack_9f8 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(kill) {
  int r;

#ifdef _WIN32
  no_term_signal = 1;
#endif

  init_process_options("spawn_helper4", kill_cb);

  /* Verify that uv_spawn() resets the signal disposition. */
#ifndef _WIN32
  {
    sigset_t set;
    sigemptyset(&set);
    sigaddset(&set, SIGTERM);
    ASSERT_OK(pthread_sigmask(SIG_BLOCK, &set, NULL));
  }
  ASSERT_NE(SIG_ERR, signal(SIGTERM, SIG_IGN));
#endif

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

#ifndef _WIN32
  {
    sigset_t set;
    sigemptyset(&set);
    sigaddset(&set, SIGTERM);
    ASSERT_OK(pthread_sigmask(SIG_UNBLOCK, &set, NULL));
  }
  ASSERT_NE(SIG_ERR, signal(SIGTERM, SIG_DFL));
#endif

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_kill(process.pid, 0);
  ASSERT_OK(r);

  /* Kill the process. */
  r = uv_kill(process.pid, SIGTERM);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}